

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O3

double __thiscall crsGA::Logger::log(Logger *this,double __x)

{
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double dVar1;
  LogMessage logMessage;
  undefined1 local_50 [32];
  _Alloc_hider local_30;
  size_type local_28;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_20;
  
  local_50._8_8_ = 0;
  local_28 = 0;
  local_20._M_local_buf[0] = '\0';
  local_30._M_p = (pointer)&local_20;
  std::__cxx11::string::_M_assign((string *)&local_30);
  local_50._8_8_ = std::chrono::_V2::system_clock::now();
  if ((this->_thread)._M_id._M_thread == 0) {
    dispatchLogMessage(this,(LogMessage *)local_50);
    dVar1 = extraout_XMM0_Qa_00;
  }
  else {
    ThreadSafeQueue<crsGA::Logger::LogMessage>::push(&this->_queue,(LogMessage *)local_50);
    dVar1 = extraout_XMM0_Qa;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_p != &local_20) {
    operator_delete(local_30._M_p,
                    CONCAT71(local_20._M_allocated_capacity._1_7_,local_20._M_local_buf[0]) + 1);
    dVar1 = extraout_XMM0_Qa_01;
  }
  return dVar1;
}

Assistant:

void Logger::log(LogLevel logLevel, const char* file, int line, const std::string& entry)
{
    LogMessage logMessage;
    logMessage.file = file;
    logMessage.line = line;
    logMessage.level = logLevel;
    logMessage.msg = entry;
    logMessage.when = std::chrono::system_clock::now();
    if (_thread.joinable())
        _queue.push(std::move(logMessage));
    else
        dispatchLogMessage(logMessage);
}